

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::
add_function<dynet::MaxPooling2D,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *side_information,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *side_information_1,
          bool *side_information_2)

{
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *k;
  reference ppNVar2;
  size_type sVar3;
  const_iterator puVar4;
  initializer_list<unsigned_int> *in_RSI;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RDI;
  VariableIndex *in_stack_00000038;
  ComputationGraph *in_stack_00000040;
  VariableIndex new_node_index;
  value_type *in_stack_ffffffffffffff88;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_stack_ffffffffffffff90;
  Device *pDVar5;
  undefined1 padding_type;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *this_00;
  initializer_list<unsigned_int> *in_stack_ffffffffffffffb8;
  MaxPooling2D *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
  padding_type = (undefined1)((ulong)in_RDI >> 0x38);
  k = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x98);
  MaxPooling2D::MaxPooling2D
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,k,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(bool)padding_type);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                      (in_stack_ffffffffffffff90);
  if ((*ppNVar2)->device == (Device *)0x0) {
    sVar3 = std::initializer_list<unsigned_int>::size(in_RSI);
    if (sVar3 == 0) {
      pDVar5 = dynet::default_device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                           dynet::default_device);
      (*ppNVar2)->device = pDVar5;
    }
    else {
      puVar4 = std::initializer_list<unsigned_int>::begin(in_RSI);
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                          (this_00,(ulong)*puVar4);
      pDVar5 = (*ppNVar2)->device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          (in_stack_ffffffffffffff90);
      (*ppNVar2)->device = pDVar5;
    }
  }
  set_dim_for_new_node(in_stack_00000040,in_stack_00000038);
  return (VariableIndex)sVar1;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}